

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_PianoWidget.cpp
# Opt level: O1

void PianoWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == keyDown && lVar3 == 0) {
      *puVar1 = 0;
    }
    else if (pcVar2 == keyChange && lVar3 == 0) {
      *puVar1 = 1;
    }
    else if (pcVar2 == keyUp && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      QMetaObject::activate(_o,&staticMetaObject,2,(void **)0x0);
      return;
    }
    if (_id == 1) {
      local_1c = *_a[1];
      iVar4 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      local_1c = *_a[1];
      iVar4 = 0;
    }
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_18);
  }
  return;
}

Assistant:

void PianoWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PianoWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->keyDown((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->keyChange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->keyUp(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PianoWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyDown)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PianoWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyChange)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PianoWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PianoWidget::keyUp)) {
                *result = 2;
                return;
            }
        }
    }
}